

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

uint8_t get_epoch(uint8_t first_byte)

{
  byte bVar1;
  
  if (-1 < (char)first_byte) {
    return '\x03';
  }
  bVar1 = first_byte & 0xf0;
  if (bVar1 == 0xc0) {
    return '\0';
  }
  if (bVar1 == 0xd0) {
    return '\x01';
  }
  if (bVar1 == 0xe0) {
    return '\x02';
  }
  __assert_fail("!\"FIXME\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x224,"uint8_t get_epoch(uint8_t)");
}

Assistant:

static inline uint8_t get_epoch(uint8_t first_byte)
{
    if (!QUICLY_PACKET_IS_LONG_HEADER(first_byte))
        return QUICLY_EPOCH_1RTT;

    switch (first_byte & QUICLY_PACKET_TYPE_BITMASK) {
    case QUICLY_PACKET_TYPE_INITIAL:
        return QUICLY_EPOCH_INITIAL;
    case QUICLY_PACKET_TYPE_HANDSHAKE:
        return QUICLY_EPOCH_HANDSHAKE;
    case QUICLY_PACKET_TYPE_0RTT:
        return QUICLY_EPOCH_0RTT;
    default:
        assert(!"FIXME");
    }
}